

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

void Nwk_ObjPrint(Nwk_Obj_t *pObj)

{
  Tim_Man_t *pTVar1;
  int iVar2;
  long lVar3;
  
  printf("ObjId = %5d.  ",(ulong)(uint)pObj->Id);
  if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
    pTVar1 = pObj->pMan->pManTime;
    if (pTVar1 != (Tim_Man_t *)0x0) {
      iVar2 = Tim_ManBoxForCi(pTVar1,*(uint *)&pObj->field_0x20 >> 7);
      if (iVar2 != -1) goto LAB_004e40a7;
    }
    printf("PI");
  }
LAB_004e40a7:
  if ((*(uint *)&pObj->field_0x20 & 7) == 2) {
    pTVar1 = pObj->pMan->pManTime;
    if (pTVar1 != (Tim_Man_t *)0x0) {
      iVar2 = Tim_ManBoxForCo(pTVar1,*(uint *)&pObj->field_0x20 >> 7);
      if (iVar2 != -1) goto LAB_004e40db;
    }
    printf("PO");
  }
LAB_004e40db:
  if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
    printf("Node");
  }
  printf("   Fanins = ");
  if (0 < pObj->nFanins) {
    lVar3 = 0;
    do {
      if (pObj->pFanio[lVar3] == (Nwk_Obj_t *)0x0) break;
      printf("%d ",(ulong)(uint)pObj->pFanio[lVar3]->Id);
      lVar3 = lVar3 + 1;
    } while (lVar3 < pObj->nFanins);
  }
  printf("   Fanouts = ");
  if (0 < pObj->nFanouts) {
    lVar3 = 0;
    do {
      if (pObj->pFanio[pObj->nFanins + lVar3] == (Nwk_Obj_t *)0x0) break;
      printf("%d ",(ulong)(uint)pObj->pFanio[pObj->nFanins + lVar3]->Id);
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 < pObj->nFanouts);
  }
  putchar(10);
  return;
}

Assistant:

void Nwk_ObjPrint( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    printf( "ObjId = %5d.  ", pObj->Id );
    if ( Nwk_ObjIsPi(pObj) )
        printf( "PI" );
    if ( Nwk_ObjIsPo(pObj) )
        printf( "PO" );
    if ( Nwk_ObjIsNode(pObj) )
        printf( "Node" );
    printf( "   Fanins = " );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "   Fanouts = " );
    Nwk_ObjForEachFanout( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "\n" );
}